

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

bool __thiscall
GdlBinaryExpression::CheckTypeAndUnits(GdlBinaryExpression *this,ExpressionType *pexptRet)

{
  GrcSymbolTableEntry *pGVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  allocator local_671;
  allocator local_670;
  allocator local_66f;
  allocator local_66e;
  allocator local_66d;
  ExpressionType expt2;
  ExpressionType expt1;
  allocator local_661;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar3 = (*this->m_pexpOperand1->_vptr_GdlExpression[10])(this->m_pexpOperand1,&expt1);
  if ((char)iVar3 == '\0') {
    return false;
  }
  iVar3 = (*this->m_pexpOperand2->_vptr_GdlExpression[10])(this->m_pexpOperand2,&expt2);
  if ((char)iVar3 == '\0') {
    return false;
  }
  *pexptRet = expt1;
  pGVar1 = this->m_psymOperator;
  std::__cxx11::string::string((string *)&local_640,"+",&local_671);
  bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_640);
  if (bVar2) {
LAB_00137b91:
    std::__cxx11::string::~string((string *)&local_640);
  }
  else {
    pGVar1 = this->m_psymOperator;
    std::__cxx11::string::string((string *)&local_5e0,"-",&local_670);
    bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_5e0);
    if (bVar2) {
LAB_00137b84:
      std::__cxx11::string::~string((string *)&local_5e0);
      goto LAB_00137b91;
    }
    pGVar1 = this->m_psymOperator;
    std::__cxx11::string::string((string *)&local_580,"*",&local_66d);
    bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_580);
    if (bVar2) {
LAB_00137b77:
      std::__cxx11::string::~string((string *)&local_580);
      goto LAB_00137b84;
    }
    pGVar1 = this->m_psymOperator;
    std::__cxx11::string::string((string *)&local_520,"/",&local_66e);
    bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_520);
    if (bVar2) {
LAB_00137b6a:
      std::__cxx11::string::~string((string *)&local_520);
      goto LAB_00137b77;
    }
    pGVar1 = this->m_psymOperator;
    std::__cxx11::string::string((string *)&local_460,"&",&local_66f);
    bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_460);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_460);
      goto LAB_00137b6a;
    }
    pGVar1 = this->m_psymOperator;
    std::__cxx11::string::string((string *)&local_40,"|",&local_661);
    bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_640);
    if (!bVar2) {
      pGVar1 = this->m_psymOperator;
      std::__cxx11::string::string((string *)&local_4a0,"&&",&local_671);
      bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_4a0);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_4a0);
LAB_001380fc:
        if (((kexptOne < expt1) || ((0x34U >> (expt1 & 0x1f) & 1) == 0)) ||
           ((kexptOne < expt2 || ((0x34U >> (expt2 & 0x1f) & 1) == 0)))) {
          std::__cxx11::string::string
                    ((string *)&local_220,"Boolean expression expected as target of ",&local_671);
          GrcSymbolTableEntry::FullName_abi_cxx11_(&local_240,this->m_psymOperator);
          std::__cxx11::string::string((string *)&local_260," operator",&local_670);
          GrcErrorList::AddWarning
                    (&g_errorList,0x9cb,&(this->super_GdlExpression).super_GdlObject,&local_220,
                     &local_240,&local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_220);
        }
        bVar2 = EquivalentTypes(expt1,expt2);
        if (((expt2 == kexptUnknown) || (expt1 == kexptUnknown)) || (bVar2)) goto LAB_001383c5;
        std::__cxx11::string::string
                  ((string *)&local_280,"Logically combining expressions of different types",
                   &local_671);
        GrcErrorList::AddWarning
                  (&g_errorList,0x9cc,&(this->super_GdlExpression).super_GdlObject,&local_280);
        psVar4 = &local_280;
      }
      else {
        pGVar1 = this->m_psymOperator;
        std::__cxx11::string::string((string *)&local_200,"||",&local_670);
        bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_4a0);
        if (bVar2) goto LAB_001380fc;
        pGVar1 = this->m_psymOperator;
        std::__cxx11::string::string((string *)&local_660,"==",&local_671);
        bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_660);
        if (bVar2) {
LAB_00138355:
          std::__cxx11::string::~string((string *)&local_660);
        }
        else {
          pGVar1 = this->m_psymOperator;
          std::__cxx11::string::string((string *)&local_600,"!=",&local_670);
          bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_600);
          if (bVar2) {
LAB_0013834b:
            std::__cxx11::string::~string((string *)&local_600);
            goto LAB_00138355;
          }
          pGVar1 = this->m_psymOperator;
          std::__cxx11::string::string((string *)&local_5a0,"<",&local_66d);
          bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_5a0);
          if (bVar2) {
LAB_0013833e:
            std::__cxx11::string::~string((string *)&local_5a0);
            goto LAB_0013834b;
          }
          pGVar1 = this->m_psymOperator;
          std::__cxx11::string::string((string *)&local_540,"<=",&local_66e);
          bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_540);
          if (bVar2) {
LAB_00138331:
            std::__cxx11::string::~string((string *)&local_540);
            goto LAB_0013833e;
          }
          pGVar1 = this->m_psymOperator;
          std::__cxx11::string::string((string *)&local_4c0,">",&local_66f);
          bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_4c0);
          if (bVar2) {
            std::__cxx11::string::~string((string *)&local_4c0);
            goto LAB_00138331;
          }
          pGVar1 = this->m_psymOperator;
          std::__cxx11::string::string((string *)&local_2a0,">=",&local_661);
          bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_600);
          std::__cxx11::string::~string((string *)&local_660);
          if (!bVar2) {
            pGVar1 = this->m_psymOperator;
            std::__cxx11::string::string((string *)&local_4e0,"max",&local_671);
            bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_4e0);
            if (bVar2) {
              std::__cxx11::string::~string((string *)&local_4e0);
            }
            else {
              pGVar1 = this->m_psymOperator;
              std::__cxx11::string::string((string *)&local_2e0,"min",&local_670);
              bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_2e0);
              std::__cxx11::string::~string((string *)&local_2e0);
              std::__cxx11::string::~string((string *)&local_4e0);
              if (!bVar2) {
                pGVar1 = this->m_psymOperator;
                std::__cxx11::string::string((string *)&local_620,"=",&local_671);
                bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_620);
                if (bVar2) {
LAB_00138789:
                  std::__cxx11::string::~string((string *)&local_620);
                }
                else {
                  pGVar1 = this->m_psymOperator;
                  std::__cxx11::string::string((string *)&local_5c0,"+=",&local_670);
                  bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_5c0);
                  if (bVar2) {
LAB_0013877c:
                    std::__cxx11::string::~string((string *)&local_5c0);
                    goto LAB_00138789;
                  }
                  pGVar1 = this->m_psymOperator;
                  std::__cxx11::string::string((string *)&local_560,"-=",&local_66d);
                  bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_560);
                  if (bVar2) {
LAB_0013876f:
                    std::__cxx11::string::~string((string *)&local_560);
                    goto LAB_0013877c;
                  }
                  pGVar1 = this->m_psymOperator;
                  std::__cxx11::string::string((string *)&local_500,"*=",&local_66e);
                  bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_500);
                  if (bVar2) {
                    std::__cxx11::string::~string((string *)&local_500);
                    goto LAB_0013876f;
                  }
                  pGVar1 = this->m_psymOperator;
                  std::__cxx11::string::string((string *)&local_3c0,"/=",&local_66f);
                  bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_3c0);
                  std::__cxx11::string::~string((string *)&local_3c0);
                  std::__cxx11::string::~string((string *)&local_500);
                  std::__cxx11::string::~string((string *)&local_560);
                  std::__cxx11::string::~string((string *)&local_5c0);
                  std::__cxx11::string::~string((string *)&local_620);
                  if (!bVar2) {
                    std::__cxx11::string::string
                              ((string *)&local_420,"Invalid binary operator: ",&local_671);
                    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_440,this->m_psymOperator);
                    GrcErrorList::AddError
                              (&g_errorList,0x83a,&(this->super_GdlExpression).super_GdlObject,
                               &local_420,&local_440);
                    std::__cxx11::string::~string((string *)&local_440);
                    psVar4 = &local_420;
                    goto LAB_00137c52;
                  }
                }
                GrcSymbolTableEntry::FullName_abi_cxx11_(&local_3e0,this->m_psymOperator);
                std::__cxx11::string::string
                          ((string *)&local_400," assignment operator not permitted in expression",
                           &local_671);
                GrcErrorList::AddError
                          (&g_errorList,0x839,&(this->super_GdlExpression).super_GdlObject,
                           &local_3e0,&local_400);
                std::__cxx11::string::~string((string *)&local_400);
                psVar4 = &local_3e0;
                goto LAB_00137c52;
              }
            }
            if ((expt2 != kexptOne &&
                ((expt2 & ~kexptBoolean) != kexptZero && (expt2 & ~kexptBoolean) != kexptNumber)) &&
                (expt1 != kexptOne &&
                ((expt1 & ~kexptBoolean) != kexptZero && (expt1 & ~kexptBoolean) != kexptNumber))) {
              std::__cxx11::string::string
                        ((string *)&local_300,"Numeric expression expected as target of ",&local_671
                        );
              GrcSymbolTableEntry::FullName_abi_cxx11_(&local_320,this->m_psymOperator);
              std::__cxx11::string::string((string *)&local_340," function",&local_670);
              GrcErrorList::AddWarning
                        (&g_errorList,0x9ce,&(this->super_GdlExpression).super_GdlObject,&local_300,
                         &local_320,&local_340);
              std::__cxx11::string::~string((string *)&local_340);
              std::__cxx11::string::~string((string *)&local_320);
              std::__cxx11::string::~string((string *)&local_300);
            }
            bVar2 = EquivalentTypes(expt1,expt2);
            if (expt2 == kexptUnknown) {
              return true;
            }
            if (expt1 == kexptUnknown) {
              return true;
            }
            if (bVar2) {
              return true;
            }
            std::__cxx11::string::string((string *)&local_360,"Calculating ",&local_671);
            GrcSymbolTableEntry::FullName_abi_cxx11_(&local_380,this->m_psymOperator);
            std::__cxx11::string::string
                      ((string *)&local_3a0," of different expression types",&local_670);
            GrcErrorList::AddWarning
                      (&g_errorList,0x9cf,&(this->super_GdlExpression).super_GdlObject,&local_360,
                       &local_380,&local_3a0);
            std::__cxx11::string::~string((string *)&local_3a0);
            std::__cxx11::string::~string((string *)&local_380);
            psVar4 = &local_360;
            goto LAB_00137e1c;
          }
        }
        bVar2 = EquivalentTypes(expt1,expt2);
        if (((expt2 == kexptUnknown) || (expt1 == kexptUnknown)) || (bVar2)) goto LAB_001383c5;
        std::__cxx11::string::string
                  ((string *)&local_2c0,"Comparing expressions of different types",&local_671);
        GrcErrorList::AddWarning
                  (&g_errorList,0x9cd,&(this->super_GdlExpression).super_GdlObject,&local_2c0);
        psVar4 = &local_2c0;
      }
      std::__cxx11::string::~string((string *)psVar4);
LAB_001383c5:
      *pexptRet = kexptBoolean;
      return true;
    }
  }
  if (expt2 == kexptSlotRef || expt1 == kexptSlotRef) {
    std::__cxx11::string::string((string *)&local_60,"Using \'",&local_671);
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_80,this->m_psymOperator);
    std::__cxx11::string::string((string *)&local_a0,"\' operator with slot indices",&local_670);
    GrcErrorList::AddError
              (&g_errorList,0x837,&(this->super_GdlExpression).super_GdlObject,&local_60,&local_80,
               &local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    psVar4 = &local_60;
LAB_00137c52:
    std::__cxx11::string::~string((string *)psVar4);
    return false;
  }
  if ((((kexptOne < expt1) || ((0x3aU >> (expt1 & 0x1f) & 1) == 0)) || (kexptOne < expt2)) ||
     ((0x3aU >> (expt2 & 0x1f) & 1) == 0)) {
    std::__cxx11::string::string
              ((string *)&local_c0,"Numeric expression expected as target of ",&local_671);
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_e0,this->m_psymOperator);
    std::__cxx11::string::string((string *)&local_100," operator.",&local_670);
    GrcErrorList::AddWarning
              (&g_errorList,0x9c7,&(this->super_GdlExpression).super_GdlObject,&local_c0,&local_e0,
               &local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  pGVar1 = this->m_psymOperator;
  std::__cxx11::string::string((string *)&local_480,"+",&local_671);
  bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_480);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_480);
  }
  else {
    pGVar1 = this->m_psymOperator;
    std::__cxx11::string::string((string *)&local_120,"-",&local_670);
    bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_480);
    if (!bVar2) {
      pGVar1 = this->m_psymOperator;
      std::__cxx11::string::string((string *)&local_160,"*",&local_671);
      bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      if (bVar2) {
        if (expt2 == kexptMeas && expt1 == kexptMeas) {
          std::__cxx11::string::string
                    ((string *)&local_180,"Multiplying two measurements",&local_671);
          GrcErrorList::AddWarning
                    (&g_errorList,0x9c9,&(this->super_GdlExpression).super_GdlObject,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
        }
        if ((expt1 == kexptMeas) || (expt2 == kexptMeas)) {
          *pexptRet = kexptMeas;
        }
        else {
          *pexptRet = kexptNumber;
        }
        return true;
      }
      pGVar1 = this->m_psymOperator;
      std::__cxx11::string::string((string *)&local_1a0,"/",&local_671);
      bVar2 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      if (!bVar2) {
        return true;
      }
      if (expt2 == kexptZero) {
        std::__cxx11::string::string((string *)&local_1e0,"Dividing by zero",&local_671);
        GrcErrorList::AddError
                  (&g_errorList,0x838,&(this->super_GdlExpression).super_GdlObject,&local_1e0);
        psVar4 = &local_1e0;
      }
      else {
        if (expt2 != kexptMeas) {
          return true;
        }
        std::__cxx11::string::string((string *)&local_1c0,"Divisor is a measurement",&local_671);
        GrcErrorList::AddWarning
                  (&g_errorList,0x9ca,&(this->super_GdlExpression).super_GdlObject,&local_1c0);
        psVar4 = &local_1c0;
      }
      goto LAB_00137e1c;
    }
  }
  bVar2 = EquivalentTypes(expt1,expt2);
  if (expt2 == kexptUnknown) {
    return true;
  }
  if (expt1 == kexptUnknown) {
    return true;
  }
  if (bVar2) {
    return true;
  }
  std::__cxx11::string::string
            ((string *)&local_140,"Adding measurement to non-measurement",&local_671);
  GrcErrorList::AddWarning
            (&g_errorList,0x9c8,&(this->super_GdlExpression).super_GdlObject,&local_140);
  psVar4 = &local_140;
LAB_00137e1c:
  std::__cxx11::string::~string((string *)psVar4);
  return true;
}

Assistant:

bool GdlBinaryExpression::CheckTypeAndUnits(ExpressionType * pexptRet)
{
	ExpressionType expt1;
	if (!m_pexpOperand1->CheckTypeAndUnits(&expt1))
		return false;
	ExpressionType expt2;
	if (!m_pexpOperand2->CheckTypeAndUnits(&expt2))
		return false;

	*pexptRet = expt1;	// unless changed below

	if (m_psymOperator->MatchesOp("+") || m_psymOperator->MatchesOp("-") ||
		m_psymOperator->MatchesOp("*") || m_psymOperator->MatchesOp("/") ||
		m_psymOperator->MatchesOp("&") || m_psymOperator->MatchesOp("|"))
	{
		//	Additive, multiplicative
		if (expt1 == kexptSlotRef || expt2 == kexptSlotRef)
		{
			g_errorList.AddError(2103, this,
				"Using '",
				m_psymOperator->FullName(),
				"' operator with slot indices");
			return false;
		}
		if ((expt1 != kexptNumber && expt1 != kexptMeas &&
				expt1 != kexptZero && expt1 != kexptOne) ||
			(expt2 != kexptNumber && expt2 != kexptMeas &&
				expt2 != kexptZero && expt2 != kexptOne))
		{
			g_errorList.AddWarning(2503, this,
				"Numeric expression expected as target of ",
				m_psymOperator->FullName(),
				" operator.");
		}

		if (m_psymOperator->MatchesOp("+") || m_psymOperator->MatchesOp("-"))
		{
			if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
				g_errorList.AddWarning(2504, this,
					"Adding measurement to non-measurement");
		}
		else if (m_psymOperator->MatchesOp("*"))
		{
			if (expt1 == kexptMeas && expt2 == kexptMeas)
				g_errorList.AddWarning(2505, this,
					"Multiplying two measurements");

			if (expt1 == kexptMeas || expt2 == kexptMeas)
				*pexptRet = kexptMeas;
			else
				*pexptRet = kexptNumber;
		}
		else if (m_psymOperator->MatchesOp("/"))
		{
			if (expt2 == kexptMeas)
				g_errorList.AddWarning(2506, this, "Divisor is a measurement");
			else if (expt2 == kexptZero)
				g_errorList.AddError(2104, this, "Dividing by zero");
		}
	}
	else if (m_psymOperator->MatchesOp("&&") || m_psymOperator->MatchesOp("||"))
	{
		//	Logical
		if ((expt1 != kexptBoolean && expt1 != kexptZero && expt1 != kexptOne) ||
			(expt2 != kexptBoolean && expt2 != kexptZero && expt2 != kexptOne))
		{
			g_errorList.AddWarning(2507, this,
				"Boolean expression expected as target of ",
				m_psymOperator->FullName(),
				" operator");
		}
		if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
			g_errorList.AddWarning(2508, this,
				"Logically combining expressions of different types");

		*pexptRet = kexptBoolean;
	}
	else if (m_psymOperator->MatchesOp("==") || m_psymOperator->MatchesOp("!=") ||
		m_psymOperator->MatchesOp("<") || m_psymOperator->MatchesOp("<=") ||
		m_psymOperator->MatchesOp(">") || m_psymOperator->MatchesOp(">="))
	{
		//	Comparative
		if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
			g_errorList.AddWarning(2509, this,
				"Comparing expressions of different types");

		*pexptRet = kexptBoolean;
	}
	else if (m_psymOperator->MatchesOp("max") || m_psymOperator->MatchesOp("min"))
	{
		//	Functional
		if (expt1 != kexptNumber && expt1 != kexptMeas &&
			expt1 != kexptSlotRef && expt1 != kexptZero && expt1 != kexptOne &&
			expt2 != kexptNumber && expt2 != kexptMeas &&
			expt2 != kexptSlotRef && expt2 != kexptZero && expt2 != kexptOne)
		{
			g_errorList.AddWarning(2510, this,
				"Numeric expression expected as target of ",
				m_psymOperator->FullName(),
				" function");
		}
		if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
			g_errorList.AddWarning(2511, this,
				"Calculating ",
				m_psymOperator->FullName(),
				" of different expression types");
	}
	else if (m_psymOperator->MatchesOp("=") ||
		m_psymOperator->MatchesOp("+=") || m_psymOperator->MatchesOp("-=") ||
		m_psymOperator->MatchesOp("*=") || m_psymOperator->MatchesOp("/="))
	{
		//	Assignment
		g_errorList.AddError(2105, this,
			m_psymOperator->FullName(),
			" assignment operator not permitted in expression");
		return false;
	}
	else
	{
		g_errorList.AddError(2106, this,
			"Invalid binary operator: ",
			m_psymOperator->FullName());
		return false;
	}

	return true;
}